

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O2

spv_result_t spvtools::val::TypePass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  uint32_t *puVar2;
  pointer puVar3;
  pointer ppVar4;
  bool bVar5;
  ushort uVar6;
  int32_t iVar7;
  spv_result_t sVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  ExecutionMode EVar12;
  StorageClass SVar13;
  StorageClass SVar14;
  Instruction *pIVar15;
  pointer psVar16;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar17;
  _Base_ptr p_Var18;
  char *pcVar19;
  pointer psVar20;
  undefined8 extraout_RDX;
  ulong uVar21;
  Op opcode;
  ulong uVar22;
  long lVar23;
  pointer ppVar24;
  uint32_t *puVar25;
  ulong uVar26;
  uint64_t dim_value;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  float local_268;
  size_t local_260;
  __node_base_ptr p_Stack_258;
  uint local_24c;
  uint64_t p_value;
  uint local_240;
  uint64_t scope_value;
  Decoration decoration;
  spv_result_t local_38;
  
  iVar7 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
  if ((iVar7 == 0) && ((inst->inst_).opcode != 0x27)) {
    return SPV_SUCCESS;
  }
  bVar5 = EnumSet<spvtools::Extension>::contains
                    (&_->module_extensions_,kSPV_VALIDATOR_ignore_type_decl_unique);
  if (bVar5) {
LAB_0059c510:
    uVar6 = (inst->inst_).opcode;
  }
  else {
    uVar6 = (inst->inst_).opcode;
    if ((((0x20 < (ulong)uVar6) || ((0x170000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
        (uVar6 != 0x1141)) && (uVar6 != 0x13d4)) {
      bVar5 = ValidationState_t::RegisterUniqueTypeDeclaration(_,inst);
      if (!bVar5) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,
                        "Duplicate non-aggregate type declarations are not allowed. Opcode: ");
        pcVar19 = spvOpcodeString((uint)uVar6);
        std::operator<<((ostream *)&decoration,pcVar19);
        std::operator<<((ostream *)&decoration," id: ");
        std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
        if (local_38 != SPV_SUCCESS) {
          return local_38;
        }
      }
      goto LAB_0059c510;
    }
  }
  switch(uVar6) {
  case 0x15:
    uVar9 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    switch(uVar9 << 0x1d | uVar9 - 8 >> 3) {
    case 0:
      if ((_->features_).declare_int8_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = 
      "Using an 8-bit integer type requires the Int8 capability, or an extension that explicitly enables 8-bit integers."
      ;
      break;
    case 1:
      if ((_->features_).declare_int16_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = 
      "Using a 16-bit integer type requires the Int16 capability, or an extension that explicitly enables 16-bit integers."
      ;
      break;
    default:
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&decoration,"Invalid number of bits (");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      pcVar19 = ") used for OpTypeInt.";
      break;
    case 3:
      uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      if (uVar9 < 2) {
        if ((inst->inst_).opcode != 0x15) {
          return SPV_SUCCESS;
        }
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        if (uVar9 == 0) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_BINARY,inst);
        pcVar19 = "The Signedness in OpTypeInt must always be 0 when Kernel capability is used.";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_VALUE,inst);
        pcVar19 = "OpTypeInt has invalid signedness:";
      }
      break;
    case 7:
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityInt64);
      if (bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Using a 64-bit integer type requires the Int64 capability.";
    }
    break;
  case 0x16:
    uVar9 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    if (uVar9 == 0x40) {
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityFloat64);
      if (bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&decoration,"Using a 64-bit floating point ");
      pcVar19 = "type requires the Float64 capability.";
    }
    else {
      if (uVar9 == 0x20) {
        return SPV_SUCCESS;
      }
      if (uVar9 == 0x10) {
        if ((_->features_).declare_float16_type != false) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,"Using a 16-bit floating point ");
        pcVar19 = 
        "type requires the Float16 or Float16Buffer capability, or an extension that explicitly enables 16-bit floating point."
        ;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,"Invalid number of bits (");
        std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
        pcVar19 = ") used for OpTypeFloat.";
      }
    }
    break;
  case 0x17:
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar15 = ValidationState_t::FindDef(_,uVar9);
    if ((pIVar15 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeIsScalarType((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&decoration,"OpTypeVector Component Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
      std::operator<<((ostream *)&decoration,(string *)&dim_value);
      pcVar19 = " is not a scalar type.";
      goto LAB_0059d984;
    }
    uVar9 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
    if (uVar9 - 2 < 3) {
      return SPV_SUCCESS;
    }
    if ((uVar9 == 0x10) || (uVar9 == 8)) {
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVector16);
      if (bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&decoration,"Having ");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      std::operator<<((ostream *)&decoration," components for ");
      pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
      std::operator<<((ostream *)&decoration,pcVar19);
      pcVar19 = " requires the Vector16 capability";
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&decoration,"Illegal number of components (");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      std::operator<<((ostream *)&decoration,") for ");
      pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
    }
    break;
  case 0x18:
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar15 = ValidationState_t::FindDef(_,uVar9);
    if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "Columns in a matrix must be of type vector.";
    }
    else {
      uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
      pIVar15 = ValidationState_t::FindDef(_,uVar9);
      if ((pIVar15->inst_).opcode == 0x16) {
        uVar9 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
        if (0xfffffffc < uVar9 - 5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Matrix types can only be parameterized as having only 2, 3, or 4 columns.";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Matrix types can only be parameterized with floating-point types.";
      }
    }
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1f:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
    goto LAB_0059e0a2;
  case 0x1c:
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar15 = ValidationState_t::FindDef(_,uVar9);
    if ((pIVar15 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "OpTypeArray Element Type <id> ";
LAB_0059d958:
      std::operator<<((ostream *)&decoration,pcVar19);
LAB_0059d96d:
      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
      std::operator<<((ostream *)&decoration,(string *)&dim_value);
      pcVar19 = " is not a type.";
      goto LAB_0059d984;
    }
    if ((pIVar15->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "OpTypeArray Element Type <id> ";
LAB_0059cee0:
      std::operator<<((ostream *)&decoration,pcVar19);
      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
      std::operator<<((ostream *)&decoration,(string *)&dim_value);
      pcVar19 = " is a void type.";
      goto LAB_0059d984;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if ((((!bVar5) || ((pIVar15->inst_).opcode != 0x1e)) ||
        ((bVar5 = ValidationState_t::HasDecoration(_,(pIVar15->inst_).result_id,Block), !bVar5 &&
         (bVar5 = ValidationState_t::HasDecoration(_,(pIVar15->inst_).result_id,BufferBlock), !bVar5
         )))) || (bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,ArrayStride),
                 !bVar5)) {
      bVar5 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar5) && ((pIVar15->inst_).opcode == 0x1d)) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&dim_value,_,0x1248,(char *)0x0);
        std::operator<<((ostream *)&decoration,(string *)&dim_value);
        pcVar19 = "OpTypeArray Element Type <id> ";
        goto LAB_0059da26;
      }
      uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar15 = ValidationState_t::FindDef(_,uVar9);
      if ((pIVar15 != (Instruction *)0x0) &&
         (iVar7 = spvOpcodeIsConstant((uint)(pIVar15->inst_).opcode), iVar7 != 0)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_value,&pIVar15->words_)
        ;
        pIVar15 = ValidationState_t::FindDef
                            (_,*(uint32_t *)(CONCAT44(p_value._4_4_,(uint)p_value) + 4));
        if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x15)) {
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          pcVar19 = "OpTypeArray Length <id> ";
LAB_0059e35d:
          std::operator<<((ostream *)&decoration,pcVar19);
          ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
          std::operator<<((ostream *)&decoration,(string *)&dim_value);
          std::operator<<((ostream *)&decoration," is not a constant integer type.");
        }
        else {
          bVar5 = ValidationState_t::EvalConstantValInt64(_,uVar9,(int64_t *)&scope_value);
          sVar8 = SPV_SUCCESS;
          if ((!bVar5) ||
             ((scope_value != 0 &&
              ((-1 < (long)scope_value ||
               ((pIVar15->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[3] == 0)))))) goto LAB_0059e3a9;
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          pcVar19 = "OpTypeArray Length <id> ";
LAB_0059dbc5:
          std::operator<<((ostream *)&decoration,pcVar19);
          ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
          std::operator<<((ostream *)&decoration,(string *)&dim_value);
          std::operator<<((ostream *)&decoration," default value must be at least 1: found ");
          std::ostream::_M_insert<long>((long)&decoration);
        }
        std::__cxx11::string::_M_dispose();
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
        sVar8 = local_38;
LAB_0059e3a9:
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_value);
        goto LAB_0059e09a;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "OpTypeArray Length <id> ";
LAB_0059e00c:
      std::operator<<((ostream *)&decoration,pcVar19);
      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
      std::operator<<((ostream *)&decoration,(string *)&dim_value);
      pcVar19 = " is not a scalar constant type.";
      goto LAB_0059d984;
    }
LAB_0059d913:
    ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
    pcVar19 = "Array containing a Block or BufferBlock must not be decorated with ArrayStride";
    break;
  case 0x1d:
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar15 = ValidationState_t::FindDef(_,uVar9);
    if ((pIVar15 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "OpTypeRuntimeArray Element Type <id> ";
      goto LAB_0059d958;
    }
    if ((pIVar15->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "OpTypeRuntimeArray Element Type <id> ";
      goto LAB_0059cee0;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if ((((bVar5) && ((pIVar15->inst_).opcode == 0x1e)) &&
        ((bVar5 = ValidationState_t::HasDecoration(_,(pIVar15->inst_).result_id,Block), bVar5 ||
         (bVar5 = ValidationState_t::HasDecoration(_,(pIVar15->inst_).result_id,BufferBlock), bVar5)
         ))) && (bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,ArrayStride),
                bVar5)) goto LAB_0059d913;
    bVar5 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    if ((pIVar15->inst_).opcode != 0x1d) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&dim_value,_,0x1248,(char *)0x0);
    std::operator<<((ostream *)&decoration,(string *)&dim_value);
    pcVar19 = "OpTypeRuntimeArray Element Type <id> ";
LAB_0059da26:
    std::operator<<((ostream *)&decoration,pcVar19);
    ValidationState_t::getIdName_abi_cxx11_((string *)&p_value,_,uVar9);
    std::operator<<((ostream *)&decoration,(string *)&p_value);
    std::operator<<((ostream *)&decoration," is not valid in ");
    spvLogStringForEnv_abi_cxx11_((string *)&scope_value,_->context_->target_env);
    std::operator<<((ostream *)&decoration,(string *)&scope_value);
    std::operator<<((ostream *)&decoration," environments.");
LAB_0059dfdf:
    std::__cxx11::string::_M_dispose();
LAB_0059e495:
    std::__cxx11::string::_M_dispose();
    goto LAB_0059d994;
  case 0x1e:
    uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    for (uVar26 = 1;
        uVar26 < (ulong)((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar26 = uVar26 + 1)
    {
      uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,uVar26);
      if (uVar9 == (inst->inst_).result_id) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "Structure members may not be self references";
        goto LAB_0059e085;
      }
      pIVar15 = ValidationState_t::FindDef(_,uVar9);
      if ((pIVar15 == (Instruction *)0x0) ||
         (iVar7 = spvOpcodeGeneratesType((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,"OpTypeStruct Member Type <id> ");
        goto LAB_0059d96d;
      }
      uVar1 = (pIVar15->inst_).opcode;
      if (uVar1 == 0x1e) {
        bVar5 = ValidationState_t::IsStructTypeWithBuiltInMember(_,uVar9);
        if (bVar5) {
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&decoration,"Structure <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
          std::operator<<((ostream *)&decoration,(string *)&dim_value);
          std::operator<<((ostream *)&decoration,
                          " contains members with BuiltIn decoration. Therefore this ");
          std::operator<<((ostream *)&decoration,
                          "structure may not be contained as a member of another ");
          std::operator<<((ostream *)&decoration,"structure ");
          std::operator<<((ostream *)&decoration,"type. Structure <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&p_value,_,uVar10);
          std::operator<<((ostream *)&decoration,(string *)&p_value);
          std::operator<<((ostream *)&decoration," contains structure <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&scope_value,_,uVar9);
          std::operator<<((ostream *)&decoration,(string *)&scope_value);
          std::operator<<((ostream *)&decoration,".");
          goto LAB_0059dfdf;
        }
      }
      else if (uVar1 == 0x13) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "Structures cannot contain a void type.";
        goto LAB_0059e085;
      }
      bVar5 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar5) && ((pIVar15->inst_).opcode == 0x1d)) {
        if (uVar26 == ((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
          bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block);
          if ((bVar5) ||
             (bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), bVar5
             )) goto LAB_0059caec;
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&dim_value,_,0x1248,(char *)0x0);
          std::operator<<((ostream *)&decoration,(string *)&dim_value);
          spvLogStringForEnv_abi_cxx11_((string *)&p_value,_->context_->target_env);
          std::operator<<((ostream *)&decoration,(string *)&p_value);
          std::operator<<((ostream *)&decoration,", OpTypeStruct containing an OpTypeRuntimeArray ")
          ;
          pcVar19 = "must be decorated with Block or BufferBlock.";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&dim_value,_,0x1248,(char *)0x0);
          std::operator<<((ostream *)&decoration,(string *)&dim_value);
          std::operator<<((ostream *)&decoration,"In ");
          spvLogStringForEnv_abi_cxx11_((string *)&p_value,_->context_->target_env);
          std::operator<<((ostream *)&decoration,(string *)&p_value);
          pcVar19 = ", OpTypeRuntimeArray must only be used for the last member of an OpTypeStruct";
        }
        std::operator<<((ostream *)&decoration,pcVar19);
        goto LAB_0059e495;
      }
LAB_0059caec:
    }
    uVar26 = 2;
    do {
      uVar22 = uVar26;
      puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar21 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
      if (uVar21 <= uVar22) break;
      decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:423:13)>
                    ::_M_invoke;
      decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)std::
                    _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:423:13)>
                    ::_M_manager;
      decoration._0_8_ = _;
      bVar5 = ValidationState_t::ContainsType
                        (_,puVar3[uVar22],
                         (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)&decoration
                         ,false);
      if (decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish != (pointer)0x0) {
        (*(code *)decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_finish)(&decoration,&decoration,3);
      }
      uVar26 = uVar22 + 1;
    } while (!bVar5);
    ValidationState_t::SetHasNestedBlockOrBufferBlockStruct
              (_,(inst->inst_).result_id,uVar22 < uVar21);
    bVar5 = ValidationState_t::GetHasNestedBlockOrBufferBlockStruct(_,(inst->inst_).result_id);
    if ((bVar5) &&
       ((bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), bVar5 ||
        (bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block), bVar5)))) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = 
      "rules: A Block or BufferBlock cannot be nested within another Block or BufferBlock. ";
      break;
    }
    dim_value = (uint64_t)&p_Stack_258;
    local_280 = 1;
    local_278._M_allocated_capacity = 0;
    local_278._8_8_ = 0;
    local_268 = 1.0;
    local_260 = 0;
    p_Stack_258 = (__node_base_ptr)0x0;
    psVar17 = ValidationState_t::id_decorations(_,uVar10);
    for (p_Var18 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var18 != &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
      Decoration::Decoration(&decoration,(Decoration *)(p_Var18 + 1));
      if ((decoration.dec_type_ == BuiltIn) && (decoration.struct_member_index_ != -1)) {
        p_value._0_4_ = decoration.struct_member_index_;
        std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&dim_value,(value_type *)&p_value);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                );
    }
    if (((int)local_278._8_4_ < 1) ||
       ((int)((ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1 == local_278._8_4_)
       ) {
      if (0 < (int)local_278._8_4_) {
        ValidationState_t::RegisterStructTypeWithBuiltInMember(_,uVar10);
      }
      bVar5 = spvIsVulkanEnv(_->context_->target_env);
      sVar8 = SPV_SUCCESS;
      if ((bVar5) && (_->options_->before_hlsl_legalization == false)) {
        decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:469:29)>
                      ::_M_invoke;
        decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)std::
                      _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:469:29)>
                      ::_M_manager;
        decoration._0_8_ = _;
        bVar5 = ValidationState_t::ContainsType
                          (_,(inst->inst_).result_id,
                           (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)
                           &decoration,true);
        if (decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          (*(code *)decoration.params_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish)(&decoration,&decoration,3);
        }
        if (bVar5) {
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&p_value,_,0x123b,(char *)0x0);
          std::operator<<((ostream *)&decoration,(string *)&p_value);
          std::operator<<((ostream *)&decoration,"In ");
          spvLogStringForEnv_abi_cxx11_((string *)&scope_value,_->context_->target_env);
          std::operator<<((ostream *)&decoration,(string *)&scope_value);
          std::operator<<((ostream *)&decoration,", OpTypeStruct must not contain an opaque type.");
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_0059dd3e;
        }
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&decoration,
                      "When BuiltIn decoration is applied to a structure-type member, ");
      std::operator<<((ostream *)&decoration,
                      "all members of that structure type must also be decorated with ");
      std::operator<<((ostream *)&decoration,"BuiltIn (No allowed mixing of built-in variables and "
                     );
      std::operator<<((ostream *)&decoration,
                      "non-built-in variables within a single structure). Structure id ");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      std::operator<<((ostream *)&decoration," does not meet this requirement.");
LAB_0059dd3e:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
      sVar8 = local_38;
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&dim_value);
    goto LAB_0059e09a;
  case 0x20:
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar15 = ValidationState_t::FindDef(_,uVar9);
    if ((pIVar15 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "OpTypePointer Type <id> ";
      goto LAB_0059d958;
    }
    SVar14 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
    if (SVar14 == StorageClassUniformConstant) {
      uVar6 = (pIVar15->inst_).opcode;
      if ((uVar6 & 0xfffe) == 0x1c) {
        uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
        pIVar15 = ValidationState_t::FindDef(_,uVar9);
        uVar6 = (pIVar15->inst_).opcode;
      }
      if ((uVar6 == 0x19) &&
         (uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar15,6), uVar9 == 2)) {
        ValidationState_t::RegisterPointerToStorageImage(_,(inst->inst_).result_id);
      }
    }
    bVar5 = ValidationState_t::IsValidStorageClass(_,SVar14);
    if (bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_BINARY,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&dim_value,_,0x1223,(char *)0x0);
    std::operator<<((ostream *)&decoration,(string *)&dim_value);
    pcVar19 = "Invalid storage class for target environment";
    goto LAB_0059d984;
  case 0x21:
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar15 = ValidationState_t::FindDef(_,uVar9);
    if ((pIVar15 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "OpTypeFunction Return Type <id> ";
      goto LAB_0059d958;
    }
    for (uVar26 = 0;
        uVar26 + 2 <
        (ulong)((long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4); uVar26 = uVar26 + 1) {
      uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,uVar26 + 2);
      pIVar15 = ValidationState_t::FindDef(_,uVar9);
      if ((pIVar15 == (Instruction *)0x0) ||
         (iVar7 = spvOpcodeGeneratesType((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "OpTypeFunction Parameter Type <id> ";
        goto LAB_0059d958;
      }
      if ((pIVar15->inst_).opcode == 0x13) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,"OpTypeFunction Parameter Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
        std::operator<<((ostream *)&decoration,(string *)&dim_value);
        pcVar19 = " cannot be OpTypeVoid.";
        goto LAB_0059d984;
      }
    }
    if ((_->options_->universal_limits_).max_function_args < uVar26) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&decoration,"OpTypeFunction may not take more than ");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      std::operator<<((ostream *)&decoration," arguments. OpTypeFunction <id> ");
      uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,0);
      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
      std::operator<<((ostream *)&decoration,(string *)&dim_value);
      std::operator<<((ostream *)&decoration," has ");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      pcVar19 = " arguments.";
    }
    else {
      ppVar24 = (inst->uses_).
                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (inst->uses_).
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (ppVar24 == ppVar4) {
          return SPV_SUCCESS;
        }
        pIVar15 = ppVar24->first;
        opcode = (Op)(pIVar15->inst_).opcode;
        if ((((opcode != OpFunction) && (bVar5 = spvOpcodeIsDebug(opcode), !bVar5)) &&
            (bVar5 = Instruction::IsNonSemantic(pIVar15), !bVar5)) &&
           (bVar5 = spvOpcodeIsDecoration((uint)(pIVar15->inst_).opcode), !bVar5)) break;
        ppVar24 = ppVar24 + 1;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,pIVar15);
      std::operator<<((ostream *)&decoration,"Invalid use of function type result id ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,(inst->inst_).result_id);
      std::operator<<((ostream *)&decoration,(string *)&dim_value);
      pcVar19 = ".";
    }
LAB_0059d984:
    std::operator<<((ostream *)&decoration,pcVar19);
LAB_0059d994:
    std::__cxx11::string::_M_dispose();
    goto LAB_0059e092;
  case 0x27:
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar15 = ValidationState_t::FindDef(_,uVar9);
    if ((pIVar15->inst_).opcode == 0x20) {
      SVar14 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      SVar13 = Instruction::GetOperandAs<spv::StorageClass>(pIVar15,1);
      if (SVar14 == SVar13) {
        uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
        pIVar15 = ValidationState_t::FindDef(_,uVar9);
        if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).opcode == 0x1e)) {
          bVar5 = spvIsVulkanEnv(_->context_->target_env);
          if (SVar14 == PhysicalStorageBuffer) {
            return SPV_SUCCESS;
          }
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&dim_value,_,0x1267,(char *)0x0);
          std::operator<<((ostream *)&decoration,(string *)&dim_value);
          std::operator<<((ostream *)&decoration,"In Vulkan, OpTypeForwardPointer must have ");
          pcVar19 = "a storage class of PhysicalStorageBuffer.";
          goto LAB_0059d984;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "Forward pointers must point to a structure";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,
                        "Storage class in OpTypeForwardPointer does not match the ");
        pcVar19 = "pointer definition.";
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "Pointer type in OpTypeForwardPointer is not a pointer type.";
    }
    break;
  default:
    if (uVar6 != 0x1141) {
      if (uVar6 == 0x1168) {
LAB_0059c7a8:
        uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
        pIVar15 = ValidationState_t::FindDef(_,uVar9);
        if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).opcode - 0x15 < 2)) {
          uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          pIVar15 = ValidationState_t::FindDef(_,uVar9);
          if ((pIVar15 == (Instruction *)0x0) ||
             ((bVar5 = ValidationState_t::IsIntScalarType(_,(pIVar15->inst_).type_id), !bVar5 ||
              (iVar7 = spvOpcodeIsConstant((uint)(pIVar15->inst_).opcode), iVar7 == 0)))) {
            ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&decoration,"OpTypeCooperativeMatrix Scope <id> ");
          }
          else {
            uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar15 = ValidationState_t::FindDef(_,uVar10);
            if (((pIVar15 == (Instruction *)0x0) ||
                (bVar5 = ValidationState_t::IsIntScalarType(_,(pIVar15->inst_).type_id), !bVar5)) ||
               (iVar7 = spvOpcodeIsConstant((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar19 = "OpTypeCooperativeMatrix Rows <id> ";
            }
            else {
              uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,4);
              pIVar15 = ValidationState_t::FindDef(_,uVar10);
              if (((pIVar15 != (Instruction *)0x0) &&
                  (bVar5 = ValidationState_t::IsIntScalarType(_,(pIVar15->inst_).type_id), bVar5))
                 && (iVar7 = spvOpcodeIsConstant((uint)(pIVar15->inst_).opcode), iVar7 != 0)) {
                if ((inst->inst_).opcode == 0x1168) {
                  uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,5);
                  pIVar15 = ValidationState_t::FindDef(_,uVar10);
                  if (((pIVar15 == (Instruction *)0x0) ||
                      (bVar5 = ValidationState_t::IsIntScalarType(_,(pIVar15->inst_).type_id),
                      !bVar5)) ||
                     (iVar7 = spvOpcodeIsConstant((uint)(pIVar15->inst_).opcode), iVar7 == 0)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
                    pcVar19 = "OpTypeCooperativeMatrixKHR Use <id> ";
                    goto LAB_0059deb7;
                  }
                }
                bVar5 = ValidationState_t::EvalConstantValUint64(_,uVar9,&scope_value);
                sVar8 = SPV_SUCCESS;
                if ((bVar5) && (sVar8 = SPV_SUCCESS, scope_value == 2)) {
                  puVar2 = (_->entry_points_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  sVar8 = SPV_SUCCESS;
                  for (puVar25 = (_->entry_points_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start; puVar25 != puVar2;
                      puVar25 = puVar25 + 1) {
                    uVar11 = *puVar25;
                    bVar5 = ValidationState_t::EntryPointHasLocalSizeOrId(_,uVar11);
                    if (!bVar5) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
                      std::operator<<((ostream *)&decoration,
                                      "OpTypeCooperativeMatrixKHR with ScopeWorkgroup ");
                      std::operator<<((ostream *)&decoration,
                                      "used without specifying LocalSize or LocalSizeId ");
                      std::operator<<((ostream *)&decoration,"for entry point <id> ");
                      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar11);
                      std::operator<<((ostream *)&decoration,(string *)&dim_value);
                      goto LAB_0059d994;
                    }
                    pIVar15 = ValidationState_t::EntryPointLocalSizeOrId(_,uVar11);
                    EVar12 = Instruction::GetOperandAs<spv::ExecutionMode>(pIVar15,1);
                    if (EVar12 == ExecutionModeLocalSizeId) {
                      p_value._0_4_ = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
                      p_value._4_4_ = Instruction::GetOperandAs<unsigned_int>(pIVar15,3);
                      local_240 = Instruction::GetOperandAs<unsigned_int>(pIVar15,4);
                      lVar23 = 0;
                      while (lVar23 != 0xc) {
                        uVar11 = *(uint32_t *)((long)&p_value + lVar23);
                        pIVar15 = ValidationState_t::FindDef(_,uVar11);
                        lVar23 = lVar23 + 4;
                        if (inst < pIVar15) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
                          std::operator<<((ostream *)&decoration,
                                          "OpTypeCooperativeMatrixKHR with ScopeWorkgroup ");
                          std::operator<<((ostream *)&decoration,
                                          "used before LocalSizeId constant value <id> ");
                          ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar11);
                          std::operator<<((ostream *)&decoration,(string *)&dim_value);
                          pcVar19 = " is defined.";
                          goto LAB_0059d984;
                        }
                      }
                    }
                  }
                }
                goto LAB_0059e09a;
              }
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar19 = "OpTypeCooperativeMatrix Cols <id> ";
            }
LAB_0059deb7:
            std::operator<<((ostream *)&decoration,pcVar19);
            uVar9 = uVar10;
          }
          ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
          std::operator<<((ostream *)&decoration,(string *)&dim_value);
          pcVar19 = " is not a constant instruction with scalar integer type.";
          goto LAB_0059d984;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "OpTypeCooperativeMatrix Component Type <id> ";
      }
      else {
        if (uVar6 != 0x14a8) {
          if (uVar6 == 0x14ee) goto LAB_0059c7a8;
          if (uVar6 == 0x14fa) {
            sVar8 = anon_unknown_2::ValidateTensorDim(_,inst);
            if (sVar8 != SPV_SUCCESS) {
              return sVar8;
            }
            uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,2);
            pIVar15 = ValidationState_t::FindDef(_,uVar10);
            if (((pIVar15 == (Instruction *)0x0) ||
                (bVar5 = ValidationState_t::IsIntScalarType(_,(pIVar15->inst_).type_id), !bVar5)) ||
               (uVar11 = ValidationState_t::GetBitWidth(_,(pIVar15->inst_).type_id), uVar11 != 0x20)
               ) {
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
              std::operator<<((ostream *)&decoration,pcVar19);
              pcVar19 = " ClampMode <id> ";
LAB_0059d4bc:
              std::operator<<((ostream *)&decoration,pcVar19);
              ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar10);
              std::operator<<((ostream *)&decoration,(string *)&dim_value);
              pcVar19 = " is not a 32-bit integer.";
            }
            else {
              bVar5 = ValidationState_t::EvalConstantValUint64(_,uVar10,&p_value);
              sVar8 = SPV_SUCCESS;
              if ((!bVar5) || (sVar8 = SPV_SUCCESS, CONCAT44(p_value._4_4_,(uint)p_value) < 5))
              goto LAB_0059e09a;
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
              std::operator<<((ostream *)&decoration,pcVar19);
              std::operator<<((ostream *)&decoration," ClampMode <id> ");
              ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar10);
              std::operator<<((ostream *)&decoration,(string *)&dim_value);
              pcVar19 = " must be a valid TensorClampMode.";
            }
          }
          else {
            if (uVar6 != 0x14fb) {
              return SPV_SUCCESS;
            }
            sVar8 = anon_unknown_2::ValidateTensorDim(_,inst);
            if (sVar8 != SPV_SUCCESS) {
              return sVar8;
            }
            uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,2);
            pIVar15 = ValidationState_t::FindDef(_,uVar9);
            if ((pIVar15 != (Instruction *)0x0) &&
               (bVar5 = ValidationState_t::IsBoolScalarType(_,(pIVar15->inst_).type_id), bVar5)) {
              psVar20 = (inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar16 = (inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar22 = ((long)psVar16 - (long)psVar20 >> 4) - 3;
              uVar9 = 0;
              local_24c = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
              for (uVar26 = 3; uVar26 < (ulong)((long)psVar16 - (long)psVar20 >> 4);
                  uVar26 = uVar26 + 1) {
                uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,uVar26);
                pIVar15 = ValidationState_t::FindDef(_,uVar10);
                if (((pIVar15 == (Instruction *)0x0) ||
                    (bVar5 = ValidationState_t::IsIntScalarType(_,(pIVar15->inst_).type_id), !bVar5)
                    ) || (uVar11 = ValidationState_t::GetBitWidth(_,(pIVar15->inst_).type_id),
                         uVar11 != 0x20)) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
                  pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
                  std::operator<<((ostream *)&decoration,pcVar19);
                  pcVar19 = " Permutation <id> ";
                  goto LAB_0059d4bc;
                }
                bVar5 = ValidationState_t::EvalConstantValUint64(_,uVar10,&p_value);
                if (bVar5) {
                  if (uVar22 <= CONCAT44(p_value._4_4_,(uint)p_value)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
                    pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
                    std::operator<<((ostream *)&decoration,pcVar19);
                    std::operator<<((ostream *)&decoration," Permutation <id> ");
                    ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar10);
                    std::operator<<((ostream *)&decoration,(string *)&dim_value);
                    pcVar19 = " must be a valid dimension.";
                    goto LAB_0059d984;
                  }
                  uVar9 = uVar9 | 1 << ((uint)p_value & 0x1f);
                }
                else {
                  local_24c = 0;
                }
                psVar20 = (inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                psVar16 = (inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              if (((local_24c & 1) == 0) || ((uVar9 ^ -1 << ((byte)uVar22 & 0x1f)) == 0xffffffff)) {
                uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
                bVar5 = ValidationState_t::EvalConstantValUint64(_,uVar9,&dim_value);
                sVar8 = SPV_SUCCESS;
                if ((!bVar5) || (dim_value == uVar22)) goto LAB_0059e09a;
                ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst)
                ;
                pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
                std::operator<<((ostream *)&decoration,pcVar19);
                pcVar19 = " Incorrect number of permutation values.";
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst)
                ;
                pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
                std::operator<<((ostream *)&decoration,pcVar19);
                pcVar19 = " Permutation values don\'t form a valid permutation.";
              }
              break;
            }
            ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
            pcVar19 = spvOpcodeString((uint)(inst->inst_).opcode);
            std::operator<<((ostream *)&decoration,pcVar19);
            std::operator<<((ostream *)&decoration," HasDimensions <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
            std::operator<<((ostream *)&decoration,(string *)&dim_value);
            pcVar19 = " is not a boolean value.";
          }
          goto LAB_0059d984;
        }
        uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
        pIVar15 = ValidationState_t::FindDef(_,uVar9);
        if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).opcode - 0x15 < 2)) {
          uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          pIVar15 = ValidationState_t::FindDef(_,uVar9);
          if ((pIVar15 != (Instruction *)0x0) &&
             (iVar7 = spvOpcodeIsConstant((uint)(pIVar15->inst_).opcode), iVar7 != 0)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_value,
                       &pIVar15->words_);
            pIVar15 = ValidationState_t::FindDef
                                (_,*(uint32_t *)(CONCAT44(p_value._4_4_,(uint)p_value) + 4));
            if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x15)) {
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar19 = "OpTypeCooperativeVectorNV component count <id> ";
              goto LAB_0059e35d;
            }
            bVar5 = ValidationState_t::EvalConstantValInt64(_,uVar9,(int64_t *)&scope_value);
            sVar8 = SPV_SUCCESS;
            if ((bVar5) &&
               ((scope_value == 0 ||
                (((long)scope_value < 0 &&
                 ((pIVar15->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[3] != 0)))))) {
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar19 = "OpTypeCooperativeVectorNV component count <id> ";
              goto LAB_0059dbc5;
            }
            goto LAB_0059e3a9;
          }
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          pcVar19 = "OpTypeCooperativeVectorNV component count <id> ";
          goto LAB_0059e00c;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar19 = "OpTypeCooperativeVectorNV Component Type <id> ";
      }
      std::operator<<((ostream *)&decoration,pcVar19);
      ValidationState_t::getIdName_abi_cxx11_((string *)&dim_value,_,uVar9);
      std::operator<<((ostream *)&decoration,(string *)&dim_value);
      pcVar19 = " is not a scalar numerical type.";
      goto LAB_0059d984;
    }
    bVar5 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    SVar14 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
    if (SVar14 == StorageClassUniform) {
      return SPV_SUCCESS;
    }
    if (SVar14 == PhysicalStorageBuffer) {
      return SPV_SUCCESS;
    }
    if (SVar14 == PushConstant) {
      return SPV_SUCCESS;
    }
    if (SVar14 == StorageBuffer) {
      return SPV_SUCCESS;
    }
    if (SVar14 == StorageClassWorkgroup) {
      bVar5 = EnumSet<spv::Capability>::contains
                        (&_->module_capabilities_,CapabilityWorkgroupMemoryExplicitLayoutKHR);
      if (bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = 
      "Workgroup storage class untyped pointers in Vulkan require WorkgroupMemoryExplicitLayoutKHR be declared"
      ;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = 
      "In Vulkan, untyped pointers can only be used in an explicitly laid out storage class";
    }
  }
LAB_0059e085:
  std::operator<<((ostream *)&decoration,pcVar19);
LAB_0059e092:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
  sVar8 = local_38;
LAB_0059e09a:
  if (sVar8 != SPV_SUCCESS) {
    return sVar8;
  }
LAB_0059e0a2:
  return SPV_SUCCESS;
}

Assistant:

spv_result_t TypePass(ValidationState_t& _, const Instruction* inst) {
  if (!spvOpcodeGeneratesType(inst->opcode()) &&
      inst->opcode() != spv::Op::OpTypeForwardPointer) {
    return SPV_SUCCESS;
  }

  if (auto error = ValidateUniqueness(_, inst)) return error;

  switch (inst->opcode()) {
    case spv::Op::OpTypeInt:
      if (auto error = ValidateTypeInt(_, inst)) return error;
      break;
    case spv::Op::OpTypeFloat:
      if (auto error = ValidateTypeFloat(_, inst)) return error;
      break;
    case spv::Op::OpTypeVector:
      if (auto error = ValidateTypeVector(_, inst)) return error;
      break;
    case spv::Op::OpTypeMatrix:
      if (auto error = ValidateTypeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeArray:
      if (auto error = ValidateTypeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeRuntimeArray:
      if (auto error = ValidateTypeRuntimeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeStruct:
      if (auto error = ValidateTypeStruct(_, inst)) return error;
      break;
    case spv::Op::OpTypePointer:
      if (auto error = ValidateTypePointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeFunction:
      if (auto error = ValidateTypeFunction(_, inst)) return error;
      break;
    case spv::Op::OpTypeForwardPointer:
      if (auto error = ValidateTypeForwardPointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      if (auto error = ValidateTypeCooperativeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      if (auto error = ValidateTypeCooperativeVectorNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      if (auto error = ValidateTypeUntypedPointerKHR(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      if (auto error = ValidateTypeTensorLayoutNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorViewNV:
      if (auto error = ValidateTypeTensorViewNV(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}